

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_text_to_content_json.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer *other;
  long lVar1;
  uint uVar2;
  char *path;
  char *path_00;
  MzpArchiveEntry MVar3;
  pointer pMVar4;
  bool bVar5;
  long lVar6;
  reference pvVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  json_value jVar11;
  undefined1 data [8];
  ulong uVar12;
  initializer_list_t init;
  initializer_list_t init_00;
  initializer_list_t init_01;
  initializer_list_t init_02;
  undefined1 local_210 [8];
  Mzp mzp;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  undefined8 local_1a0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_198;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_180;
  undefined8 local_170;
  undefined1 local_168 [8];
  string digest_bytes;
  string digest_hex;
  undefined1 local_120 [8];
  string serialized_json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_f0;
  undefined8 local_e0;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_d8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_c0;
  undefined8 local_b0;
  undefined1 auStack_a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  string_data;
  undefined1 local_88 [8];
  json j;
  vector<unsigned_int,_std::allocator<unsigned_int>_> string_data_offsets;
  undefined1 local_50 [8];
  string script_text_raw;
  
  if (argc != 3) {
    main_cold_1();
    return -1;
  }
  path = argv[1];
  path_00 = argv[2];
  local_50 = (undefined1  [8])&script_text_raw._M_string_length;
  script_text_raw._M_dataplus._M_p = (pointer)0x0;
  script_text_raw._M_string_length._0_1_ = 0;
  bVar5 = mg::fs::read_file(path,(string *)local_50);
  if (!bVar5) {
    fprintf(_stderr,"Failed to read script text from \'%s\'\n",path);
    iVar10 = -1;
    goto LAB_0010adec;
  }
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  mzp.entry_data.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mzp.header.magic[0] = '\0';
  mzp.header.magic[1] = '\0';
  mzp.header.magic[2] = '\0';
  mzp.header.magic[3] = '\0';
  mzp.header.magic[4] = '\0';
  mzp.header.magic[5] = '\0';
  mzp.header.archive_entry_count = 0;
  mzp.entry_headers.
  super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bVar5 = mg::data::mzp_read((string *)local_50,(Mzp *)local_210);
  if (bVar5) {
    if ((ulong)((long)mzp.entry_data.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start -
               (long)mzp.entry_headers.
                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage) < 0x21) {
      main_cold_3();
      goto LAB_0010ae52;
    }
    MVar3 = *mzp.entry_headers.
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    uVar12 = (ulong)mzp.entry_headers.
                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage[1] >> 2;
    j.m_value.object = (object_t *)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&j.m_value,uVar12 & 0xffffffff
              );
    pMVar4 = mzp.entry_headers.
             super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if ((int)uVar12 != 0) {
      uVar9 = 0;
      do {
        uVar2 = *(uint *)((long)MVar3 + uVar9 * 4);
        *(uint *)(&((j.m_value.object)->_M_t)._M_impl.field_0x0 + uVar9 * 4) =
             uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        uVar9 = uVar9 + 1;
      } while ((uVar12 & 0xffffffff) != uVar9);
    }
    auStack_a8 = (undefined1  [8])0x0;
    string_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    string_data.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (j.m_value.object != (object_t *)0x0) {
      uVar12 = ((long)mzp.entry_headers.
                      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage[4] +
               (long)mzp.entry_headers.
                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[5]) - 1;
      jVar11 = j.m_value;
      do {
        uVar9 = (ulong)*(uint *)&((jVar11.object)->_M_t)._M_impl;
        local_120 = (undefined1  [8])((long)pMVar4[4] + uVar9);
        lVar6 = uVar9 + (long)pMVar4[4];
        uVar9 = lVar6 + 1;
        if (uVar9 < uVar12) {
          uVar8 = 0;
          do {
            if ((*(char *)(lVar6 + uVar8) == '\r') && (*(char *)(uVar9 + uVar8) == '\n')) {
              local_d8.owned_value._0_8_ = uVar8;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*const&,long>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         auStack_a8,(char **)local_120,(long *)&local_d8);
              break;
            }
            lVar1 = uVar9 + uVar8;
            uVar8 = uVar8 + 1;
          } while (lVar1 + 1U < uVar12);
        }
        jVar11.object = (object_t *)&((jVar11.object)->_M_t)._M_impl.field_0x4;
      } while (jVar11.object != (object_t *)0x0);
    }
    local_88[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   )0x0;
    j.m_type = null;
    j._1_7_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_88,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_88,true);
    digest_hex.field_2._8_8_ =
         string_data.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_a8 !=
        (undefined1  [8])
        string_data.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      data = auStack_a8;
      do {
        sha256((string *)local_168,(string *)data);
        mg::string::bytes_to_hex((string *)((long)&digest_bytes.field_2 + 8),(string *)local_168);
        local_d8.owned_value._0_8_ = local_d8.owned_value._0_8_ & 0xffffffffffffff00;
        local_d8.owned_value.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[3],_0>
                  (&local_d8.owned_value,(char (*) [3])"jp");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_d8.owned_value,true);
        local_d8.value_ref = (value_type *)0x0;
        local_c0.m_type = null;
        local_c0.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (&local_c0,(string_t *)data);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_c0,true);
        local_b0 = 0;
        init._M_len = 2;
        init._M_array = &local_d8;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)local_120,init,true,array);
        serialized_json._M_string_length = 0;
        local_1c8.owned_value.m_type = null;
        local_1c8.owned_value.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[3],_0>
                  (&local_1c8.owned_value,(char (*) [3])"en");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_1c8.owned_value,true);
        local_1c8.value_ref = (value_type *)0x0;
        local_1b0.m_type = null;
        local_1b0.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[1],_0>
                  (&local_1b0,(char (*) [1])0x112179);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_1b0,true);
        local_1a0 = 0;
        init_00._M_len = 2;
        init_00._M_array = &local_1c8;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&serialized_json.field_2,init_00,true,array);
        local_198.owned_value.m_type = null;
        local_198.owned_value.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[6],_0>
                  (&local_198.owned_value,(char (*) [6])"notes");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_198.owned_value,true);
        local_198.value_ref = (value_type *)0x0;
        local_180.m_type = null;
        local_180.m_value.object = (object_t *)0x0;
        nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
        construct<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[1],_0>
                  (&local_180,(char (*) [1])0x112179);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::assert_invariant(&local_180,true);
        local_170 = 0;
        init_01._M_len = 2;
        init_01._M_array = &local_198;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json(&local_f0,init_01,true,array);
        local_e0 = 0;
        init_02._M_len = 3;
        init_02._M_array = (iterator)local_120;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      *)&mzp.entry_data.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,init_02,true,array);
        pvVar7 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                             *)local_88,"script_text_by_hash");
        pvVar7 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator[](pvVar7,(key_type *)((long)&digest_bytes.field_2 + 8));
        other = &mzp.entry_data.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::operator=(pvVar7,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            *)other);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                       *)other);
        lVar6 = 0x30;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(local_120 + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
        lVar6 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(&local_198.owned_value.m_type + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
        lVar6 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(&local_1c8.owned_value.m_type + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
        lVar6 = 0x18;
        do {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         *)(&local_d8.owned_value.m_type + lVar6));
          lVar6 = lVar6 + -0x18;
        } while (lVar6 != -0x18);
        if ((size_type *)digest_bytes.field_2._8_8_ != &digest_hex._M_string_length) {
          operator_delete((void *)digest_bytes.field_2._8_8_,digest_hex._M_string_length + 1);
        }
        if (local_168 != (undefined1  [8])&digest_bytes._M_string_length) {
          operator_delete((void *)local_168,digest_bytes._M_string_length + 1);
        }
        data = (undefined1  [8])((long)data + 0x20);
      } while (data != (undefined1  [8])digest_hex.field_2._8_8_);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::dump((string_t *)local_120,
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            *)local_88,2,' ',false,strict);
    bVar5 = mg::fs::write_file(path_00,(string *)local_120);
    iVar10 = 0;
    if (!bVar5) {
      fprintf(_stderr,"Failed to write \'%s\'\n",path_00);
      iVar10 = -1;
    }
    if (local_120 != (undefined1  [8])&serialized_json._M_string_length) {
      operator_delete((void *)local_120,serialized_json._M_string_length + 1);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)local_88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_a8);
    if (j.m_value.object != (object_t *)0x0) {
      operator_delete(j.m_value.object,-j.m_value.number_integer);
    }
  }
  else {
    main_cold_2();
LAB_0010ae52:
    iVar10 = -1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mzp.entry_headers.
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (mzp.header != (MzpArchiveHeader)0x0) {
    operator_delete((void *)mzp.header,
                    (long)mzp.entry_headers.
                          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)mzp.header);
  }
LAB_0010adec:
  if (local_50 != (undefined1  [8])&script_text_raw._M_string_length) {
    operator_delete((void *)local_50,
                    CONCAT71(script_text_raw._M_string_length._1_7_,
                             (undefined1)script_text_raw._M_string_length) + 1);
  }
  return iVar10;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s script_text.mrg out.json\n", argv[0]);
    return -1;
  }

  // Name args
  const char *script_text_filename = argv[1];
  const char *output_filename = argv[2];

  // Try and load script_text
  std::string script_text_raw;
  if (!mg::fs::read_file(script_text_filename, script_text_raw)) {
    fprintf(stderr, "Failed to read script text from '%s'\n",
            script_text_filename);
    return -1;
  }

  // Attempt to parse script text as MZP archive
  mg::data::Mzp mzp;
  if (!mg::data::mzp_read(script_text_raw, mzp)) {
    fprintf(stderr, "Failed to parse script data as MZP\n");
    return -1;
  }

  // The script text consists of 10 entries, consisting of 5 pairs of string
  // table offsets / string table data.
  // All of the string tables other than the first pair seem to just contain a
  // \r\n and nothing else.
  if (mzp.entry_data.size() < 2) {
    fprintf(stderr, "Script data does not contain enough entries\n");
    return -1;
  }

  // Extract the string offset table
  const std::string &string_offsets_raw = mzp.entry_data[0];
  const uint32_t *string_offsets_u32 =
      reinterpret_cast<const uint32_t *>(string_offsets_raw.data());
  const unsigned string_offset_count =
      string_offsets_raw.size() / sizeof(uint32_t);
  std::vector<uint32_t> string_data_offsets;
  string_data_offsets.resize(string_offset_count);
  for (unsigned i = 0; i < string_offset_count; i++) {
    string_data_offsets[i] = mg::be_to_host_u32(string_offsets_u32[i]);
  }

  // Now that we have offsets, iterate the string data and extract from each
  // start offset until we hit \r\n
  const std::string &string_data_raw = mzp.entry_data[1];
  const char *const end_ptr = &string_data_raw[string_data_raw.size() - 1];
  std::vector<std::string> string_data;
  for (uint32_t offset : string_data_offsets) {
    // Get a pointer to the start of string
    const char *const start = &string_data_raw[offset];

    // Seek for \r\n
    const char *seek_r = start;
    const char *seek_n = start + 1;
    bool found_end = false;
    while (seek_n < end_ptr &&
           !(found_end = (*seek_r == '\r' && *seek_n == '\n'))) {
      seek_r++;
      seek_n++;
    }

    // Scoop the data from start to seek_r into a string
    if (found_end) {
      string_data.emplace_back(start, seek_r - start);
    }
  }

  // Generate a content hash for each string and encode as json
  nlohmann::json j;
  for (auto &string : string_data) {
    const std::string digest_bytes = sha256(string);
    const std::string digest_hex = mg::string::bytes_to_hex(digest_bytes);
    j["script_text_by_hash"][digest_hex] = {
        {"jp", string},
        {"en", ""},
        {"notes", ""},
    };
  }

  // Serialize and emit
  const std::string serialized_json = j.dump(2);
  if (!mg::fs::write_file(output_filename, serialized_json)) {
    fprintf(stderr, "Failed to write '%s'\n", output_filename);
    return -1;
  }

  return 0;
}